

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall CVmObjByteArray::alloc_array(CVmObjByteArray *this,unsigned_long ele_count)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  uchar **ppuVar3;
  uchar ***pppuVar4;
  uchar *puVar5;
  ulong in_RSI;
  CVmObjByteArray *in_RDI;
  size_t pgsiz;
  size_t pg;
  unsigned_long pgcnt;
  uchar **pgtab;
  size_t i;
  size_t alloc_size;
  size_t slot_cnt;
  unsigned_long ele_rem;
  unsigned_long in_stack_ffffffffffffff98;
  uchar **ppuVar6;
  CVmObjByteArray *pCVar7;
  CVmObjByteArray *this_00;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  CVmObjByteArray *local_30;
  ulong local_18;
  
  if (in_RSI == 0) {
    pCVar7 = (CVmObjByteArray *)0x0;
  }
  else {
    pCVar7 = (CVmObjByteArray *)((in_RSI - 1 >> 0x1c) + 1);
  }
  this_00 = pCVar7;
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,(long)pCVar7 * 8 + 4,in_RDI);
  (in_RDI->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
  set_element_count(this_00,in_stack_ffffffffffffff98);
  local_18 = in_RSI;
  for (local_30 = (CVmObjByteArray *)0x0; local_30 < pCVar7;
      local_30 = (CVmObjByteArray *)((long)&(local_30->super_CVmObject)._vptr_CVmObject + 1)) {
    local_40 = (local_18 - 1 >> 0xf) + 1;
    if (0x2000 < local_40) {
      local_40 = 0x2000;
    }
    ppuVar3 = (uchar **)malloc(local_40 << 3);
    ppuVar6 = ppuVar3;
    pppuVar4 = get_page_table_array(in_RDI);
    pppuVar4[(long)local_30] = ppuVar6;
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = 0x8000;
      if (local_18 < 0x8000) {
        local_50 = local_18;
      }
      local_18 = local_18 - local_50;
      puVar5 = (uchar *)malloc(local_50);
      ppuVar3[local_48] = puVar5;
    }
  }
  return;
}

Assistant:

void CVmObjByteArray::alloc_array(VMG_ unsigned long ele_count)
{
    unsigned long ele_rem;
    size_t slot_cnt;
    size_t alloc_size;
    size_t i;
    
    /* 
     *   figure out how many first-level page tables we need - each
     *   first-level page table refers to 256M bytes (8k pages per
     *   second-level page table times 32k bytes per page), so we need one
     *   page table pointer per 256 megabytes == 2^15*2^32 == 2^28.  
     */
    slot_cnt = (ele_count == 0 ? 0 : ((size_t)((ele_count - 1) >> 28) + 1));

    /* 
     *   allocate the extension - 4 bytes for the element count plus one
     *   (char **) per slot 
     */
    alloc_size = 4 + slot_cnt*sizeof(char **);
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(alloc_size, this);

    /* set the element count */
    set_element_count(ele_count);

    /* allocate the second-level page tables */
    for (ele_rem = ele_count, i = 0 ; i < slot_cnt ; ++i)
    {
        unsigned char **pgtab;
        unsigned long pgcnt;
        size_t pg;
        
        /* 
         *   Determine how many pages we need in this page table.  Each page
         *   holds 32k bytes, so we need one page per 32k bytes remaining to
         *   allocate.  However, each page table can hold only up to 8k page
         *   pointers, so limit this table to 8k pages. 
         */
        pgcnt = ((ele_rem - 1) >> 15) + 1;
        if (pgcnt > 8*1024)
            pgcnt = 8*1024;

        /* allocate this second-level page table */
        pgtab = (unsigned char **)t3malloc(
            (size_t)(pgcnt * sizeof(unsigned char *)));

        /* set this page table pointer */
        get_page_table_array()[i] = pgtab;

        /* allocate the pages in this table */
        for (pg = 0 ; pg < pgcnt ; ++pg)
        {
            size_t pgsiz;

            /* 
             *   calculate the size for this page - the maximum size of a
             *   page is 32k, but allocate only the amount remaining if we
             *   have less than 32k left to allocate 
             */
            pgsiz = 32*1024;
            if (pgsiz > ele_rem)
                pgsiz = (size_t)ele_rem;

            /* deduct this page's size from the remaining element count */
            ele_rem -= pgsiz;

            /* allocate and store this page */
            pgtab[pg] = (unsigned char *)t3malloc(pgsiz);
        }
    }
}